

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool,false,true>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char **ppcVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  char **local_68;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar8 = *(ulong *)&rdata->value;
      pcVar4 = (rdata->value).pointer.ptr;
      local_68 = &(ldata->value).pointer.ptr;
      iVar12 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_68 + -1);
        uVar9._0_4_ = paVar1->length;
        uVar9._4_1_ = paVar1->prefix[0];
        uVar9._5_1_ = paVar1->prefix[1];
        uVar9._6_1_ = paVar1->prefix[2];
        uVar9._7_1_ = paVar1->prefix[3];
        bVar6 = true;
        if ((uVar9 == uVar8) &&
           ((*local_68 == pcVar4 ||
            ((0xc < (uint)(undefined4)uVar9 &&
             (iVar5 = bcmp(*local_68,pcVar4,uVar9 & 0xffffffff), iVar5 == 0)))))) {
          bVar6 = false;
        }
        result_data[iVar12] = bVar6;
        iVar12 = iVar12 + 1;
        local_68 = local_68 + 2;
      } while (count != iVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar9 = 0;
    uVar8 = 0;
    do {
      uVar3 = puVar2[uVar9];
      uVar13 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar13 = count;
      }
      uVar7 = uVar13;
      if (uVar3 != 0) {
        uVar7 = uVar8;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar8 < uVar13) {
            uVar3 = *(ulong *)&rdata->value;
            pcVar4 = (rdata->value).pointer.ptr;
            ppcVar10 = &ldata[uVar8].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar10 + -1);
              uVar8._0_4_ = paVar1->length;
              uVar8._4_1_ = paVar1->prefix[0];
              uVar8._5_1_ = paVar1->prefix[1];
              uVar8._6_1_ = paVar1->prefix[2];
              uVar8._7_1_ = paVar1->prefix[3];
              bVar6 = true;
              if ((uVar8 == uVar3) &&
                 ((*ppcVar10 == pcVar4 ||
                  ((0xc < (uint)(undefined4)uVar8 &&
                   (iVar5 = bcmp(*ppcVar10,pcVar4,uVar8 & 0xffffffff), iVar5 == 0)))))) {
                bVar6 = false;
              }
              result_data[uVar7] = bVar6;
              uVar7 = uVar7 + 1;
              ppcVar10 = ppcVar10 + 2;
            } while (uVar13 != uVar7);
          }
        }
        else if (uVar8 < uVar13) {
          ppcVar10 = &ldata[uVar8].value.pointer.ptr;
          uVar11 = 0;
          do {
            if ((uVar3 >> (uVar11 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar10 + -1);
              uVar7._0_4_ = paVar1->length;
              uVar7._4_1_ = paVar1->prefix[0];
              uVar7._5_1_ = paVar1->prefix[1];
              uVar7._6_1_ = paVar1->prefix[2];
              uVar7._7_1_ = paVar1->prefix[3];
              bVar6 = true;
              if (uVar7 == *(ulong *)&rdata->value) {
                pcVar4 = (rdata->value).pointer.ptr;
                if ((*ppcVar10 == pcVar4) ||
                   ((0xc < (uint)(undefined4)uVar7 &&
                    (iVar5 = bcmp(*ppcVar10,pcVar4,uVar7 & 0xffffffff), iVar5 == 0)))) {
                  bVar6 = false;
                }
              }
              result_data[uVar8] = bVar6;
            }
            uVar8 = uVar8 + 1;
            ppcVar10 = ppcVar10 + 2;
            uVar11 = uVar11 + 1;
            uVar7 = uVar8;
          } while (uVar13 != uVar8);
        }
      }
      uVar9 = uVar9 + 1;
      uVar8 = uVar7;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}